

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall wasm::WATParser::Lexer::skipSpace(Lexer *this)

{
  pointer *ppAVar1;
  iterator __position;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  undefined1 in_RCX [8];
  undefined1 auVar5 [8];
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  size_type __n;
  undefined8 uVar9;
  undefined8 uVar10;
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  string_view sv;
  string_view in_04;
  string_view in_05;
  string_view in_06;
  string_view in_07;
  string_view in_08;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view s;
  string_view sVar11;
  Annotation local_f0;
  undefined1 local_d0;
  vector<wasm::WATParser::Annotation,std::allocator<wasm::WATParser::Annotation>> *local_c8;
  undefined1 local_c0 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  undefined1 local_a0 [8];
  undefined1 local_98 [24];
  bool local_80;
  undefined1 local_78 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> ctx;
  char *local_58;
  IString *pIStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  local_c8 = (vector<wasm::WATParser::Annotation,std::allocator<wasm::WATParser::Annotation>> *)
             &this->annotations;
  do {
    while( true ) {
      _local_78 = (LexResult)next(this);
      local_48 = (char *)0x0;
      pcStack_40 = (char *)0x0;
      local_58 = (char *)0x0;
      pIStack_50 = (IString *)0x0;
      ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = (char *)0x0;
      ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_engaged = false;
      ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _17_7_ = 0;
      local_38 = (char *)0x0;
      sVar11._M_str = ";;@";
      sVar11._M_len = 3;
      sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_78,sVar11);
      if (sVar2 != 0) break;
      sv._M_str = "(@";
      sv._M_len = 2;
      sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_78,sv);
      uVar9 = ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_str;
      if (sVar2 == 0) goto LAB_00b7cb07;
      ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str =
           ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
           _M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
           _M_payload._M_value.span._M_str + 2;
      auVar5 = local_78;
      uVar10 = ctx.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _M_payload._M_value.span._M_str;
      if ((ulong)local_78 <
          ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._M_value.span._M_str) {
LAB_00b7cc12:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar10,auVar5);
      }
      local_58 = (char *)((long)ctx.
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                ._M_payload._M_value.span._M_str +
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_len);
      in._M_str = (char *)local_78;
      in._M_len = (size_t)local_58;
      in_RCX = local_78;
      ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _16_8_ = (anon_unknown_0 *)
               ((long)local_78 -
               (long)ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_str);
      anon_unknown_0::idchar
                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_c0,
                 (anon_unknown_0 *)
                 ((long)local_78 -
                 (long)ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str),in);
      if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ == '\x01') {
        do {
          pIStack_50 = (IString *)((long)&(pIStack_50->str)._M_len + 1);
          ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._M_value.span._M_str =
               ctx.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _M_payload._M_value.span._M_str + 1;
          auVar5 = local_78;
          uVar10 = ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._M_value.span._M_str;
          if ((ulong)local_78 <
              ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
          in_00._M_len = (char *)((long)ctx.
                                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                        ._M_payload.
                                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                        ._M_payload._M_value.span._M_str +
                                 ctx.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                 ._M_payload._M_value.span._M_len);
          in_00._M_str = (char *)local_78;
          anon_unknown_0::idchar
                    ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_c0,
                     (anon_unknown_0 *)
                     ((long)local_78 -
                     (long)ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_str),in_00);
        } while (lexed.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _M_payload._8_1_ == '\x01');
        auVar5 = local_78;
        uVar10 = ctx.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _M_payload._M_value.span._M_str;
        if ((ulong)local_78 <
            ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
        pcStack_40 = ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_str +
                     ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_len;
        local_48 = (char *)((long)local_78 -
                           ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._8_8_);
        in_RCX = local_78;
        if (local_48 != (char *)0x0) {
          lVar6 = 1;
          do {
            in_04._M_len = (long)local_78 -
                           ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._8_8_;
            auVar5 = local_78;
            uVar10 = ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_str;
            if ((ulong)local_78 <
                ctx.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
            in_04._M_str = ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_str +
                           ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_len;
            anon_unknown_0::space
                      ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_c0,in_04
                      );
            if (lexed.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._8_1_ == '\x01') {
LAB_00b7c90a:
              local_38 = local_38 + (long)local_c0;
              ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_str =
                   ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._M_value.span._M_str + (long)local_c0;
            }
            else {
              in_05._M_len = (long)local_78 -
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._8_8_;
              auVar5 = local_78;
              uVar10 = ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str;
              if ((ulong)local_78 <
                  ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
              in_05._M_str = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::keyword
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_c0,
                         in_05);
              if (lexed.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._8_1_ == '\x01') goto LAB_00b7c90a;
              in_06._M_len = (long)local_78 -
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._8_8_;
              auVar5 = local_78;
              uVar10 = ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str;
              if ((ulong)local_78 <
                  ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
              in_06._M_str = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::integer
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_c0,
                         in_06);
              if (local_a0[0] == '\x01') goto LAB_00b7c90a;
              in_07._M_len = (long)local_78 -
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._8_8_;
              auVar5 = local_78;
              uVar10 = ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str;
              if ((ulong)local_78 <
                  ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
              in_07._M_str = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::float_
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)
                         local_c0,in_07);
              if (local_98[0] == '\x01') goto LAB_00b7c90a;
              in_08._M_len = (long)local_78 -
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._8_8_;
              auVar5 = local_78;
              uVar10 = ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str;
              if ((ulong)local_78 <
                  ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
              in_08._M_str = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                                  local_c0,in_08);
              if ((bool)local_98[0x10] == true) {
                local_38 = local_38 + (long)local_c0;
                ctx.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._M_value.span._M_str =
                     ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_str + (long)local_c0;
                local_98[0x10] = false;
                if (local_98[8] == '\x01') {
                  local_98[8] = '\0';
                  if ((undefined1 *)
                      CONCAT71(lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._9_7_,
                               lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._8_1_) != local_a0) {
                    lVar7 = CONCAT71(local_a0._1_7_,local_a0[0]);
                    puVar8 = (undefined1 *)
                             CONCAT71(lexed.
                                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                      ._M_payload._9_7_,
                                      lexed.
                                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                      ._M_payload._8_1_);
LAB_00b7c9f9:
                    local_98[0x10] = false;
                    operator_delete(puVar8,lVar7 + 1);
                  }
                }
              }
              else {
                auVar5 = local_78;
                uVar10 = ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str;
                if ((ulong)local_78 <
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str) goto LAB_00b7cc12;
                in_01._M_len = ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._M_value.span._M_str +
                               ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._M_value.span._M_len;
                in_01._M_str = (char *)local_78;
                in_RCX = local_78;
                anon_unknown_0::ident
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_c0
                           ,(anon_unknown_0 *)
                            ((long)local_78 -
                            ctx.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                            ._M_payload._8_8_),in_01);
                if (local_80 == true) {
                  local_38 = local_38 + (long)local_c0;
                  ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str =
                       ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str + (long)local_c0;
                  local_80 = false;
                  if (((bool)local_98[0x10] == true) &&
                     (local_98[0x10] = false,
                     (undefined1 *)
                     lexed.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._16_8_ != local_98)) {
                    lVar7 = CONCAT71(local_98._1_7_,local_98[0]);
                    puVar8 = (undefined1 *)
                             lexed.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._16_8_;
                    goto LAB_00b7c9f9;
                  }
                }
                else {
                  sv_00._M_str = "(@";
                  sv_00._M_len = 2;
                  sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_78,sv_00);
                  if (sVar2 == 0) {
                    sv_01._M_str = "(";
                    sv_01._M_len = 1;
                    sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_78,sv_01);
                    if (sVar2 == 0) {
                      sv_02._M_str = ")";
                      sv_02._M_len = 1;
                      sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_78,sv_02);
                      if (sVar2 != 0) {
                        lVar6 = lVar6 + -1;
                        if (lVar6 != 0) {
                          local_38 = local_38 + 1;
                          ctx.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._M_payload._M_value.span._M_str =
                               ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._M_value.span._M_str + 1;
                          goto LAB_00b7c919;
                        }
                        uVar9 = ctx.
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                ._M_payload._M_value.span._M_str + 1;
                        goto LAB_00b7cb07;
                      }
                      break;
                    }
                    local_38 = local_38 + 1;
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str =
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str + 1;
                  }
                  else {
                    local_38 = local_38 + 2;
                    uVar10 = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str + 2;
                    auVar5 = local_78;
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str = (char *)uVar10;
                    if ((ulong)local_78 < (ulong)uVar10) goto LAB_00b7cc12;
                    in_02._M_len = (char *)(uVar10 + ctx.
                                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                                  ._M_payload._M_value.span._M_len);
                    in_02._M_str = (char *)local_78;
                    in_RCX = local_78;
                    anon_unknown_0::idchar
                              ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                               local_c0,(anon_unknown_0 *)((long)local_78 - uVar10),in_02);
                    if (lexed.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._M_payload._8_1_ != '\x01') break;
                    do {
                      local_38 = local_38 + 1;
                      uVar10 = ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._M_value.span._M_str + 1;
                      auVar5 = local_78;
                      ctx.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_payload._M_value.span._M_str = (char *)uVar10;
                      if ((ulong)local_78 < (ulong)uVar10) goto LAB_00b7cc12;
                      in_03._M_len = (char *)(uVar10 + ctx.
                                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                                  ._M_payload._M_value.span._M_len);
                      in_03._M_str = (char *)local_78;
                      anon_unknown_0::idchar
                                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                                 local_c0,(anon_unknown_0 *)((long)local_78 - uVar10),in_03);
                    } while (lexed.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._8_1_ == '\x01');
                  }
                  lVar6 = lVar6 + 1;
                }
              }
            }
LAB_00b7c919:
            in_RCX = local_78;
          } while (local_78 !=
                   (undefined1  [8])
                   ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._M_value.span._M_str);
        }
      }
LAB_00b7cba9:
      sVar11 = next(this);
      anon_unknown_0::space
                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_78,sVar11);
      if (ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ != '\x01') {
        return;
      }
      this->pos = this->pos + (long)local_78;
    }
    uVar9 = local_78;
    uVar10 = ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
             ._M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
             _M_payload._M_value.span._M_str + 3;
    ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _16_8_ = srcAnnotationKind;
    local_58 = DAT_010b2140;
    pIStack_50 = srcAnnotationKind;
    auVar5 = local_78;
    if ((ulong)local_78 < (ulong)uVar10) goto LAB_00b7cc12;
    pcStack_40 = (char *)(uVar10 + ctx.
                                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                   ._M_payload._M_value.span._M_len);
    local_48 = (char *)((long)local_78 - uVar10);
    in_RCX = (undefined1  [8])DAT_010b2140;
    local_38 = local_48;
    if (local_48 != (char *)0x0) {
      pvVar3 = memchr(pcStack_40,10,(size_t)local_48);
      in_RCX = (undefined1  [8])(ulong)(pvVar3 == (void *)0x0);
      pcVar4 = (char *)((long)pvVar3 - (long)pcStack_40);
      if (pcVar4 != (char *)0xffffffffffffffff && pvVar3 != (void *)0x0) {
        uVar9 = (char *)(uVar10 + (long)pcVar4);
        local_38 = pcVar4;
      }
    }
LAB_00b7cb07:
    ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _M_payload._M_value.span._M_str = (char *)uVar9;
    if (ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._M_value.span._M_str == (char *)0x0) goto LAB_00b7cba9;
    uVar9 = ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._M_value.span._M_str;
    if ((ulong)local_78 <
        ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._M_value.span._M_str) {
      uVar9 = local_78;
    }
    if ((ulong)ctx.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _16_8_ < pIStack_50) {
      pIStack_50 = (IString *)
                   ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _16_8_;
    }
    s._M_str = (char *)0x0;
    s._M_len = (size_t)local_58;
    local_f0.kind.super_IString.str = (IString)IString::interned(pIStack_50,s,SUB81(in_RCX,0));
    local_f0.contents._M_str = pcStack_40;
    in_RCX = (undefined1  [8])local_38;
    if (local_48 < local_38) {
      in_RCX = (undefined1  [8])local_48;
    }
    local_d0 = 1;
    this->pos = (size_t)(uVar9 + this->pos);
    __position._M_current =
         (this->annotations).
         super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_f0.contents._M_len = (size_t)in_RCX;
    if (__position._M_current ==
        (this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::WATParser::Annotation,std::allocator<wasm::WATParser::Annotation>>::
      _M_realloc_insert<wasm::WATParser::Annotation_const&>(local_c8,__position,&local_f0);
    }
    else {
      ((__position._M_current)->contents)._M_len = (size_t)in_RCX;
      ((__position._M_current)->contents)._M_str = pcStack_40;
      ((__position._M_current)->kind).super_IString.str._M_len =
           local_f0.kind.super_IString.str._M_len;
      ((__position._M_current)->kind).super_IString.str._M_str =
           local_f0.kind.super_IString.str._M_str;
      ppAVar1 = &(this->annotations).
                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
  } while( true );
}

Assistant:

void Lexer::skipSpace() {
  while (true) {
    if (auto ctx = annotation(next())) {
      pos += ctx->span.size();
      annotations.push_back(ctx->annotation);
      continue;
    }
    if (auto ctx = space(next())) {
      pos += ctx->span.size();
      continue;
    }
    break;
  }
}